

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vnode.c
# Opt level: O0

int evfilt_vnode_knote_create(filter *filt,knote *kn)

{
  int iVar1;
  undefined8 *in_RSI;
  stat_conflict sb;
  knote *in_stack_00000f90;
  filter *in_stack_00000f98;
  stat sStack_a8;
  undefined8 *local_18;
  int local_4;
  
  local_18 = in_RSI;
  iVar1 = fstat((int)*in_RSI,&sStack_a8);
  if (iVar1 < 0) {
    local_4 = -1;
  }
  else {
    local_18[0x10] = sStack_a8.st_nlink;
    local_18[0x11] = sStack_a8.st_size;
    local_18[2] = 0xffffffffffffffff;
    local_4 = add_watch(in_stack_00000f98,in_stack_00000f90);
  }
  return local_4;
}

Assistant:

int
evfilt_vnode_knote_create(struct filter *filt, struct knote *kn)
{
    struct stat sb;

    if (fstat(kn->kev.ident, &sb) < 0) {
        dbg_puts("fstat failed");
        return (-1);
    }
    kn->kn_vnode.nlink = sb.st_nlink;
    kn->kn_vnode.size = sb.st_size;
    kn->kev.data = -1;

    return (add_watch(filt, kn));
}